

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

bool __thiscall glcts::anon_unknown_0::DefOccurence::occurs(DefOccurence *this,GLenum shader)

{
  bool local_29;
  GLenum shader_local;
  DefOccurence *this_local;
  
  if (this->occurence == NONE_SH) {
    this_local._7_1_ = false;
  }
  else if (this->occurence == ALL_SH) {
    this_local._7_1_ = true;
  }
  else if (this->occurence == FSH_OR_CSH) {
    local_29 = shader == 0x8b30 || shader == 0x91b9;
    this_local._7_1_ = local_29;
  }
  else if (this->occurence == VSH) {
    this_local._7_1_ = shader == 0x8b31;
  }
  else if (this->occurence == ALL_BUT_FSH) {
    this_local._7_1_ = shader != 0x8b30;
  }
  else {
    if (this->occurence != ALL_BUT_VSH) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x88,"bool glcts::(anonymous namespace)::DefOccurence::occurs(GLenum) const");
    }
    this_local._7_1_ = shader != 0x8b31;
  }
  return this_local._7_1_;
}

Assistant:

bool occurs(GLenum shader) const
	{
		if (occurence == NONE_SH)
		{
			return false;
		}
		if (occurence == ALL_SH)
		{
			return true;
		}
		if (occurence == FSH_OR_CSH)
		{
			return shader == GL_FRAGMENT_SHADER || shader == GL_COMPUTE_SHADER;
		}
		if (occurence == VSH)
		{
			return shader == GL_VERTEX_SHADER;
		}
		if (occurence == ALL_BUT_FSH)
		{
			return shader != GL_FRAGMENT_SHADER;
		}
		if (occurence == ALL_BUT_VSH)
		{
			return shader != GL_VERTEX_SHADER;
		}
		assert(0);
		return false;
	}